

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help.hpp
# Opt level: O3

void __thiscall
pstore::command_line::help<std::basic_ostream<char,_std::char_traits<char>_>_>::show
          (help<std::basic_ostream<char,_std::char_traits<char>_>_> *this)

{
  long *plVar1;
  _Base_ptr p_Var2;
  long lVar3;
  long lVar4;
  anon_class_40_5_f37d82ab __f;
  size_t sVar5;
  ostream *poVar6;
  options_container *all;
  size_t sVar7;
  string *text;
  _Base_ptr p_Var8;
  options_set *extraout_RDX;
  options_set *extraout_RDX_00;
  options_set *ops;
  long lVar9;
  _Base_ptr *pp_Var10;
  bool is_first;
  bool is_overlong;
  size_t indent;
  czstring new_line;
  categories_collection categories;
  char local_17a;
  bool local_179;
  size_t local_178;
  _Rb_tree<pstore::gsl::not_null<const_pstore::command_line::option_*>,_std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>,_std::_Select1st<std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>_>,_pstore::command_line::details::less_name,_std::allocator<std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>_>_>
  local_170;
  _Rb_tree_node_base *local_140;
  option *local_138;
  size_t local_130;
  char *local_128;
  char *local_120;
  bool *pbStack_118;
  help<std::basic_ostream<char,_std::char_traits<char>_>_> *local_110;
  char **ppcStack_108;
  size_t *local_100;
  word_wrapper local_f8;
  word_wrapper local_c0;
  _Rb_tree<const_pstore::command_line::option_category_*,_std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>,_std::_Select1st<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>,_std::less<const_pstore::command_line::option_category_*>,_std::allocator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>_>
  local_88;
  anon_class_40_5_f37d82ab local_58;
  
  sVar5 = details::get_max_width();
  local_128 = "\n";
  poVar6 = this->outs_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"OVERVIEW: ",10);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(this->overview_)._M_dataplus._M_p,(this->overview_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  usage(this);
  all = option::all_abi_cxx11_();
  details::build_categories((categories_collection *)&local_88,&this->super_option,all);
  sVar7 = details::widest_option((categories_collection *)&local_88);
  local_130 = sVar7 + 3;
  if ((_Rb_tree_header *)local_88._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_88._M_impl.super__Rb_tree_header) {
    local_178 = (sVar5 - sVar7) - 5;
    sVar5 = 0x7fffffff;
    p_Var8 = local_88._M_impl.super__Rb_tree_header._M_header._M_left;
    if (sVar7 < 0x7fffffff) {
      sVar5 = sVar7;
    }
    do {
      pp_Var10 = &local_170._M_impl.super__Rb_tree_header._M_header._M_parent;
      poVar6 = this->outs_;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      plVar1 = *(long **)(p_Var8 + 1);
      local_170._M_impl._0_8_ = pp_Var10;
      if (plVar1 == (long *)0x0) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"OPTIONS","");
      }
      else {
        std::__cxx11::string::_M_construct<char*>((string *)&local_170,*plVar1,plVar1[1] + *plVar1);
      }
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_170._M_impl._0_8_,
                          local_170._M_impl.super__Rb_tree_header._M_header._0_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,":\n\n",3);
      ops = extraout_RDX;
      if ((_Base_ptr *)local_170._M_impl._0_8_ != pp_Var10) {
        operator_delete((void *)local_170._M_impl._0_8_,
                        (ulong)((long)&(local_170._M_impl.super__Rb_tree_header._M_header._M_parent)
                                       ->_M_color + 1));
        ops = extraout_RDX_00;
      }
      local_140 = p_Var8;
      details::get_switch_strings_abi_cxx11_
                ((switch_strings *)&local_170,(details *)&p_Var8[1]._M_parent,ops);
      for (p_Var8 = local_170._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var8 != &local_170._M_impl.super__Rb_tree_header;
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
        local_138 = *(option **)(p_Var8 + 1);
        local_17a = '\x01';
        local_179 = false;
        if (p_Var8[1]._M_parent != (_Base_ptr)0x0) {
          p_Var2 = p_Var8[3]._M_left;
          lVar9 = (long)p_Var8[1]._M_parent * 0x28;
          do {
            pp_Var10 = &p_Var2->_M_parent;
            if (local_17a == '\0') {
              std::__ostream_insert<char,std::char_traits<char>>(this->outs_,"\n",1);
            }
            poVar6 = this->outs_;
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  ",2);
            lVar3 = *(long *)poVar6;
            lVar4 = *(long *)(lVar3 + -0x18);
            *(uint *)(poVar6 + lVar4 + 0x18) = *(uint *)(poVar6 + lVar4 + 0x18) & 0xffffff4f | 0x20;
            *(size_t *)(poVar6 + *(long *)(lVar3 + -0x18) + 0x10) = sVar5;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,(char *)*pp_Var10,(long)pp_Var10[1]);
            local_17a = '\0';
            sVar7 = utf::length((string *)pp_Var10);
            if (sVar7 != *(size_t *)(pp_Var10 + -1)) {
              assert_failed("pstore::utf::length (std::get<std::string> (name)) == std::get<std::size_t> (name)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/command_line/help.hpp"
                            ,0xd6);
            }
            local_179 = 0x14 < sVar7;
            p_Var2 = (_Base_ptr)(pp_Var10 + 4);
            lVar9 = lVar9 + -0x28;
          } while (lVar9 != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(this->outs_," - ",3);
        text = option::description_abi_cxx11_(local_138);
        local_17a = '\x01';
        word_wrapper::word_wrapper(&local_c0,text,local_178,0);
        word_wrapper::end(&local_f8,text,local_178);
        local_120 = &local_17a;
        pbStack_118 = &local_179;
        ppcStack_108 = &local_128;
        local_100 = &local_130;
        __f.is_overlong = pbStack_118;
        __f.is_first = (bool *)local_120;
        __f.this = this;
        __f.new_line = ppcStack_108;
        __f.indent = local_100;
        local_110 = this;
        std::
        for_each<pstore::command_line::word_wrapper,pstore::command_line::help<std::ostream>::show()::_lambda(std::__cxx11::string_const&)_1_>
                  (&local_58,&local_c0,&local_f8,__f);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8.substr_._M_dataplus._M_p != &local_f8.substr_.field_2) {
          operator_delete(local_f8.substr_._M_dataplus._M_p,
                          local_f8.substr_.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0.substr_._M_dataplus._M_p != &local_c0.substr_.field_2) {
          operator_delete(local_c0.substr_._M_dataplus._M_p,
                          local_c0.substr_.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(this->outs_,"\n",1);
      }
      std::
      _Rb_tree<pstore::gsl::not_null<const_pstore::command_line::option_*>,_std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>,_std::_Select1st<std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>_>,_pstore::command_line::details::less_name,_std::allocator<std::pair<const_pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::small_vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_1UL>_>_>_>
      ::~_Rb_tree(&local_170);
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(local_140);
    } while ((_Rb_tree_header *)p_Var8 != &local_88._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<const_pstore::command_line::option_category_*,_std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>,_std::_Select1st<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>,_std::less<const_pstore::command_line::option_category_*>,_std::allocator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>_>
  ::~_Rb_tree(&local_88);
  return;
}

Assistant:

void help<OutputStream>::show () {
            static constexpr char const separator[] = " - ";
            static constexpr auto const separator_len = array_elements (separator) - 1U;

            std::size_t const max_width = details::get_max_width ();
            auto const new_line = ostream_traits::out_text ("\n");

            outs_ << ostream_traits::out_text ("OVERVIEW: ")
                  << ostream_traits::out_string (overview_) << new_line;
            usage ();

            auto const categories = details::build_categories (this, option::all ());
            std::size_t const max_name_len = widest_option (categories);

            auto const indent = max_name_len + separator_len;
            auto const description_width =
                max_width - max_name_len - separator_len - details::prefix_indent_len;

            for (auto const & cat : categories) {
                outs_ << new_line
                      << ostream_traits::out_string (cat.first == nullptr ? "OPTIONS"
                                                                          : cat.first->title ())
                      << ostream_traits::out_text (":\n\n");

                for (auto const & sw : details::get_switch_strings (cat.second)) {
                    option const * const op = sw.first;
                    auto is_first = true;
                    auto is_overlong = false;
                    for (std::tuple<std::string, std::size_t> const & name : sw.second) {
                        if (!is_first) {
                            outs_ << new_line;
                        }
                        outs_ << details::prefix_indent << std::left
                              << std::setw (details::int_cast (max_name_len))
                              << ostream_traits::out_string (std::get<std::string> (name));

                        is_first = false;
                        PSTORE_ASSERT (pstore::utf::length (std::get<std::string> (name)) ==
                                       std::get<std::size_t> (name));
                        is_overlong = std::get<std::size_t> (name) > details::overlong_opt_max;
                    }
                    outs_ << separator;

                    std::string const & description = op->description ();
                    is_first = true;
                    std::for_each (word_wrapper (description, description_width),
                                   word_wrapper::end (description, description_width),
                                   [&] (std::string const & str) {
                                       if (!is_first || is_overlong) {
                                           outs_ << new_line
                                                 << std::setw (details::int_cast (
                                                        indent + details::prefix_indent_len))
                                                 << ' ';
                                       }
                                       outs_ << ostream_traits::out_string (str);
                                       is_first = false;
                                       is_overlong = false;
                                   });
                    outs_ << new_line;
                }
            }
        }